

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_0::MergingIterator::Seek(MergingIterator *this,Slice *target)

{
  int local_1c;
  int i;
  Slice *target_local;
  MergingIterator *this_local;
  
  for (local_1c = 0; local_1c < this->n_; local_1c = local_1c + 1) {
    IteratorWrapper::Seek(this->children_ + local_1c,target);
  }
  FindSmallest(this);
  this->direction_ = kForward;
  return;
}

Assistant:

void Seek(const Slice& target) override {
    for (int i = 0; i < n_; i++) {
      children_[i].Seek(target);
    }
    FindSmallest();
    direction_ = kForward;
  }